

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::Connection::Connection
          (Connection *this,uint64_t insertionOrder,uint64_t src,uint64_t dest,string *prop,
          Document *doc)

{
  pointer pcVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  
  this->insertionOrder = insertionOrder;
  (this->prop)._M_dataplus._M_p = (pointer)&(this->prop).field_2;
  pcVar1 = (prop->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->prop,pcVar1,pcVar1 + prop->_M_string_length);
  this->src = src;
  this->dest = dest;
  this->doc = doc;
  p_Var2 = (doc->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var5 = &(doc->objects)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var5->_M_header;
    p_Var4 = p_Var2;
    do {
      if (*(ulong *)(p_Var4 + 1) >= src) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < src];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var5) && (*(ulong *)(p_Var3 + 1) <= src)) {
      p_Var4 = &p_Var5->_M_header;
      if (dest != 0) {
        do {
          if (*(ulong *)(p_Var2 + 1) >= dest) {
            p_Var4 = p_Var2;
          }
          p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < dest];
        } while (p_Var2 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var4 == p_Var5) || (dest < *(ulong *)(p_Var4 + 1))) {
          __assert_fail("!dest || doc.Objects().find(dest) != doc.Objects().end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXDocument.cpp"
                        ,0x2a2,
                        "Assimp::FBX::Connection::Connection(uint64_t, uint64_t, uint64_t, const std::string &, const Document &)"
                       );
        }
      }
      return;
    }
  }
  __assert_fail("doc.Objects().find(src) != doc.Objects().end()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXDocument.cpp"
                ,0x2a0,
                "Assimp::FBX::Connection::Connection(uint64_t, uint64_t, uint64_t, const std::string &, const Document &)"
               );
}

Assistant:

Connection::Connection(uint64_t insertionOrder,  uint64_t src, uint64_t dest, const std::string& prop,
        const Document& doc)

: insertionOrder(insertionOrder)
, prop(prop)
, src(src)
, dest(dest)
, doc(doc)
{
    ai_assert(doc.Objects().find(src) != doc.Objects().end());
    // dest may be 0 (root node)
    ai_assert(!dest || doc.Objects().find(dest) != doc.Objects().end());
}